

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-server-close.c
# Opt level: O1

int run_test_pipe_server_close(void)

{
  int iVar1;
  int extraout_EAX;
  uv_pipe_t *puVar2;
  undefined8 uVar3;
  int in_ESI;
  uv_pipe_t *in_RDI;
  
  puVar2 = (uv_pipe_t *)uv_default_loop();
  if (puVar2 == (uv_pipe_t *)0x0) {
    run_test_pipe_server_close_cold_9();
LAB_001662c2:
    run_test_pipe_server_close_cold_1();
LAB_001662c7:
    run_test_pipe_server_close_cold_2();
LAB_001662cc:
    run_test_pipe_server_close_cold_3();
LAB_001662d1:
    puVar2 = in_RDI;
    run_test_pipe_server_close_cold_4();
LAB_001662d6:
    run_test_pipe_server_close_cold_5();
LAB_001662db:
    run_test_pipe_server_close_cold_6();
  }
  else {
    in_ESI = 0x310230;
    in_RDI = puVar2;
    iVar1 = uv_pipe_init(puVar2,&pipe_server,0);
    if (iVar1 != 0) goto LAB_001662c2;
    in_RDI = &pipe_server;
    in_ESI = 0x17e322;
    iVar1 = uv_pipe_bind();
    if (iVar1 != 0) goto LAB_001662c7;
    in_RDI = &pipe_server;
    in_ESI = 0;
    iVar1 = uv_listen(&pipe_server,0,pipe_server_connection_cb);
    if (iVar1 != 0) goto LAB_001662cc;
    in_ESI = 0x310338;
    in_RDI = puVar2;
    iVar1 = uv_pipe_init(puVar2,&pipe_client,0);
    if (iVar1 != 0) goto LAB_001662d1;
    uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
    in_ESI = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_001662d6;
    if (pipe_client_connect_cb_called != 1) goto LAB_001662db;
    if (pipe_close_cb_called == 2) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      in_ESI = 0;
      uv_run(uVar3);
      puVar2 = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001662e5;
    }
  }
  run_test_pipe_server_close_cold_7();
LAB_001662e5:
  run_test_pipe_server_close_cold_8();
  if (in_ESI == 0) {
    return extraout_EAX;
  }
  pipe_server_connection_cb_cold_1();
  if (puVar2 == (uv_pipe_t *)&connect_req) {
    if (in_ESI == 0) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      uv_close(&pipe_client,pipe_close_cb);
      iVar1 = uv_close(&pipe_server,pipe_close_cb);
      return iVar1;
    }
  }
  else {
    pipe_client_connect_cb_cold_1();
  }
  pipe_client_connect_cb_cold_2();
  if (puVar2 == &pipe_server || puVar2 == &pipe_client) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)CONCAT71(0x3103,puVar2 == &pipe_client);
  }
  pipe_close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_server_close) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT(r == 0);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(pipe_client_connect_cb_called == 1);
  ASSERT(pipe_close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}